

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O2

int32_t icu_63::DayPeriodRulesDataSink::parseHour(UnicodeString *time,UErrorCode *errorCode)

{
  short sVar1;
  char16_t cVar2;
  char16_t cVar3;
  int32_t iVar4;
  int iVar5;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar1 = (time->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (time->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    if (0xfffffffd < iVar4 - 6U) {
      cVar2 = icu_63::UnicodeString::doCharAt(time,iVar4 + -3);
      if ((((cVar2 == L':') &&
           (cVar2 = icu_63::UnicodeString::doCharAt(time,iVar4 + -2), cVar2 == L'0')) &&
          (cVar2 = icu_63::UnicodeString::doCharAt(time,iVar4 + -1), cVar2 == L'0')) &&
         (cVar2 = icu_63::UnicodeString::doCharAt(time,0), 0xfff5 < (ushort)(cVar2 + L'ￆ'))) {
        if (iVar4 + -3 != 2) {
          return (ushort)cVar2 - 0x30;
        }
        cVar3 = icu_63::UnicodeString::doCharAt(time,1);
        if ((0xfff5 < (ushort)(cVar3 + L'ￆ')) &&
           (iVar5 = ((ushort)cVar2 - 0x30) * 10 + (uint)(ushort)cVar3 + -0x30, iVar5 < 0x19)) {
          return iVar5;
        }
      }
    }
    *errorCode = U_INVALID_FORMAT_ERROR;
  }
  return 0;
}

Assistant:

static int32_t parseHour(const UnicodeString &time, UErrorCode &errorCode) {
        if (U_FAILURE(errorCode)) {
            return 0;
        }

        int32_t hourLimit = time.length() - 3;
        // `time` must look like "x:00" or "xx:00".
        // If length is wrong or `time` doesn't end with ":00", error out.
        if ((hourLimit != 1 && hourLimit != 2) ||
                time[hourLimit] != 0x3A || time[hourLimit + 1] != 0x30 ||
                time[hourLimit + 2] != 0x30) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return 0;
        }

        // If `time` doesn't begin with a number in [0, 24], error out.
        // Note: "24:00" is possible in "before 24:00".
        int32_t hour = time[0] - 0x30;
        if (hour < 0 || 9 < hour) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return 0;
        }
        if (hourLimit == 2) {
            int32_t hourDigit2 = time[1] - 0x30;
            if (hourDigit2 < 0 || 9 < hourDigit2) {
                errorCode = U_INVALID_FORMAT_ERROR;
                return 0;
            }
            hour = hour * 10 + hourDigit2;
            if (hour > 24) {
                errorCode = U_INVALID_FORMAT_ERROR;
                return 0;
            }
        }

        return hour;
    }